

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

Function * __thiscall soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,Function *f)

{
  bool bVar1;
  reference o;
  pool_ref<soul::AST::VariableDeclaration> *v;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *__range2;
  Function *f_local;
  RewritingASTVisitor *this_local;
  
  replaceExpression(this,&f->returnType);
  __end2 = std::
           vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ::begin(&f->parameters);
  v = (pool_ref<soul::AST::VariableDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
      ::end(&f->parameters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                                *)&v);
    if (!bVar1) break;
    o = __gnu_cxx::
        __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
        ::operator*(&__end2);
    replaceAs<soul::AST::VariableDeclaration>(this,o);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
    ::operator++(&__end2);
  }
  replaceAs<soul::AST::Block>(this,&f->block);
  return f;
}

Assistant:

virtual AST::Function& visit (AST::Function& f)
    {
        replaceExpression (f.returnType);

        for (auto& v : f.parameters)
            replaceAs<AST::VariableDeclaration> (v);

        replaceAs<AST::Block> (f.block);
        return f;
    }